

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-reset.c
# Opt level: O3

int run_test_tcp_close_reset_client(void)

{
  int iVar1;
  int iVar2;
  uv_loop_t *puVar3;
  undefined8 uVar4;
  undefined8 *extraout_RDX;
  undefined8 unaff_RBX;
  uv_tcp_t *in_RSI;
  uv_tcp_t *handle;
  uv_tcp_t *puVar5;
  undefined1 auStack_38 [16];
  uv_loop_t *puStack_28;
  undefined1 auStack_20 [16];
  code *pcStack_10;
  
  pcStack_10 = (code *)0x1718e6;
  loop = (uv_loop_t *)uv_default_loop();
  pcStack_10 = (code *)0x1718f5;
  start_server(loop,in_RSI);
  client_close = 1;
  shutdown_before_close = 0;
  pcStack_10 = (code *)0x17190f;
  puVar3 = loop;
  do_connect(loop,in_RSI);
  if (write_cb_called == 0) {
    if (close_cb_called != 0) goto LAB_00171994;
    if (shutdown_cb_called != 0) goto LAB_00171999;
    pcStack_10 = (code *)0x171938;
    puVar3 = loop;
    iVar1 = uv_run(loop,0);
    if (iVar1 != 0) goto LAB_0017199e;
    if (write_cb_called != 4) goto LAB_001719a3;
    if (close_cb_called != 1) goto LAB_001719a8;
    if (shutdown_cb_called != 0) goto LAB_001719ad;
    pcStack_10 = (code *)0x17195c;
    unaff_RBX = uv_default_loop();
    pcStack_10 = (code *)0x171970;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_10 = (code *)0x17197a;
    uv_run(unaff_RBX,0);
    pcStack_10 = (code *)0x17197f;
    puVar3 = (uv_loop_t *)uv_default_loop();
    pcStack_10 = (code *)0x171987;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_10 = (code *)0x171994;
    run_test_tcp_close_reset_client_cold_1();
LAB_00171994:
    pcStack_10 = (code *)0x171999;
    run_test_tcp_close_reset_client_cold_2();
LAB_00171999:
    pcStack_10 = (code *)0x17199e;
    run_test_tcp_close_reset_client_cold_3();
LAB_0017199e:
    pcStack_10 = (code *)0x1719a3;
    run_test_tcp_close_reset_client_cold_4();
LAB_001719a3:
    pcStack_10 = (code *)0x1719a8;
    run_test_tcp_close_reset_client_cold_5();
LAB_001719a8:
    pcStack_10 = (code *)0x1719ad;
    run_test_tcp_close_reset_client_cold_6();
LAB_001719ad:
    pcStack_10 = (code *)0x1719b2;
    run_test_tcp_close_reset_client_cold_7();
  }
  pcStack_10 = start_server;
  run_test_tcp_close_reset_client_cold_8();
  puVar5 = (uv_tcp_t *)0x194b4a;
  puStack_28 = (uv_loop_t *)0x1719d3;
  pcStack_10 = (code *)unaff_RBX;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_20);
  if (iVar1 == 0) {
    puStack_28 = (uv_loop_t *)0x1719e6;
    puVar5 = (uv_tcp_t *)puVar3;
    iVar1 = uv_tcp_init(puVar3,&tcp_server);
    if (iVar1 != 0) goto LAB_00171a26;
    puVar5 = &tcp_server;
    puStack_28 = (uv_loop_t *)0x1719fb;
    iVar1 = uv_tcp_bind(&tcp_server,auStack_20,0);
    if (iVar1 != 0) goto LAB_00171a2b;
    puVar5 = &tcp_server;
    puStack_28 = (uv_loop_t *)0x171a17;
    iVar1 = uv_listen(&tcp_server,0x80,connection_cb);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    puStack_28 = (uv_loop_t *)0x171a26;
    start_server_cold_1();
LAB_00171a26:
    puStack_28 = (uv_loop_t *)0x171a2b;
    start_server_cold_2();
LAB_00171a2b:
    puStack_28 = (uv_loop_t *)0x171a30;
    start_server_cold_3();
  }
  puStack_28 = (uv_loop_t *)do_connect;
  start_server_cold_4();
  handle = (uv_tcp_t *)0x23a3;
  puStack_28 = puVar3;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_38);
  if (iVar1 == 0) {
    handle = &tcp_client;
    iVar1 = uv_tcp_init(puVar5);
    if (iVar1 != 0) goto LAB_00171a94;
    handle = &tcp_client;
    iVar1 = uv_tcp_connect(&connect_req,&tcp_client,auStack_38,connect_cb);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    do_connect_cold_1();
LAB_00171a94:
    do_connect_cold_2();
  }
  do_connect_cold_3();
  loop = (uv_loop_t *)uv_default_loop();
  start_server(loop,handle);
  client_close = 1;
  shutdown_before_close = 1;
  do_connect(loop,handle);
  if (write_cb_called == 0) {
    if (close_cb_called != 0) goto LAB_00171b52;
    if (shutdown_cb_called != 0) goto LAB_00171b57;
    handle = (uv_tcp_t *)0x0;
    iVar1 = uv_run(loop);
    if (iVar1 != 0) goto LAB_00171b5c;
    if (write_cb_called != 4) goto LAB_00171b61;
    if (close_cb_called != 0) goto LAB_00171b66;
    if (shutdown_cb_called != 1) goto LAB_00171b6b;
    uVar4 = uv_default_loop();
    uv_walk(uVar4,close_walk_cb,0);
    handle = (uv_tcp_t *)0x0;
    uv_run(uVar4);
    uVar4 = uv_default_loop();
    iVar1 = uv_loop_close(uVar4);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_tcp_close_reset_client_after_shutdown_cold_1();
LAB_00171b52:
    run_test_tcp_close_reset_client_after_shutdown_cold_2();
LAB_00171b57:
    run_test_tcp_close_reset_client_after_shutdown_cold_3();
LAB_00171b5c:
    run_test_tcp_close_reset_client_after_shutdown_cold_4();
LAB_00171b61:
    run_test_tcp_close_reset_client_after_shutdown_cold_5();
LAB_00171b66:
    run_test_tcp_close_reset_client_after_shutdown_cold_6();
LAB_00171b6b:
    run_test_tcp_close_reset_client_after_shutdown_cold_7();
  }
  run_test_tcp_close_reset_client_after_shutdown_cold_8();
  loop = (uv_loop_t *)uv_default_loop();
  start_server(loop,handle);
  client_close = 0;
  shutdown_before_close = 0;
  do_connect(loop,handle);
  if (write_cb_called == 0) {
    if (close_cb_called != 0) goto LAB_00171c29;
    if (shutdown_cb_called != 0) goto LAB_00171c2e;
    handle = (uv_tcp_t *)0x0;
    iVar1 = uv_run(loop);
    if (iVar1 != 0) goto LAB_00171c33;
    if (write_cb_called != 4) goto LAB_00171c38;
    if (close_cb_called != 1) goto LAB_00171c3d;
    if (shutdown_cb_called != 0) goto LAB_00171c42;
    uVar4 = uv_default_loop();
    uv_walk(uVar4,close_walk_cb,0);
    handle = (uv_tcp_t *)0x0;
    uv_run(uVar4);
    uVar4 = uv_default_loop();
    iVar1 = uv_loop_close(uVar4);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_tcp_close_reset_accepted_cold_1();
LAB_00171c29:
    run_test_tcp_close_reset_accepted_cold_2();
LAB_00171c2e:
    run_test_tcp_close_reset_accepted_cold_3();
LAB_00171c33:
    run_test_tcp_close_reset_accepted_cold_4();
LAB_00171c38:
    run_test_tcp_close_reset_accepted_cold_5();
LAB_00171c3d:
    run_test_tcp_close_reset_accepted_cold_6();
LAB_00171c42:
    run_test_tcp_close_reset_accepted_cold_7();
  }
  run_test_tcp_close_reset_accepted_cold_8();
  loop = (uv_loop_t *)uv_default_loop();
  start_server(loop,handle);
  client_close = 0;
  shutdown_before_close = 1;
  puVar3 = loop;
  do_connect(loop,handle);
  iVar1 = (int)handle;
  if (write_cb_called == 0) {
    if (close_cb_called != 0) goto LAB_00171d00;
    if (shutdown_cb_called != 0) goto LAB_00171d05;
    iVar1 = 0;
    puVar3 = loop;
    iVar2 = uv_run(loop);
    if (iVar2 != 0) goto LAB_00171d0a;
    if (write_cb_called != 4) goto LAB_00171d0f;
    if (close_cb_called != 0) goto LAB_00171d14;
    if (shutdown_cb_called != 1) goto LAB_00171d19;
    uVar4 = uv_default_loop();
    uv_walk(uVar4,close_walk_cb,0);
    iVar1 = 0;
    uv_run(uVar4);
    puVar3 = (uv_loop_t *)uv_default_loop();
    iVar2 = uv_loop_close(puVar3);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_tcp_close_reset_accepted_after_shutdown_cold_1();
LAB_00171d00:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_2();
LAB_00171d05:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_3();
LAB_00171d0a:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_4();
LAB_00171d0f:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_5();
LAB_00171d14:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_6();
LAB_00171d19:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_7();
  }
  run_test_tcp_close_reset_accepted_after_shutdown_cold_8();
  if (iVar1 == 0) {
    iVar1 = uv_tcp_init(loop,&tcp_accepted);
    if (iVar1 == 0) {
      iVar1 = uv_accept(puVar3,&tcp_accepted);
      if (iVar1 == 0) {
        iVar1 = uv_read_start(&tcp_accepted,alloc_cb,read_cb);
        return iVar1;
      }
      goto LAB_00171d7a;
    }
  }
  else {
    connection_cb_cold_1();
  }
  connection_cb_cold_2();
LAB_00171d7a:
  connection_cb_cold_3();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 0x400;
  return 0x31d840;
}

Assistant:

TEST_IMPL(tcp_close_reset_client) {
  int r;

  loop = uv_default_loop();

  start_server(loop, &tcp_server);

  client_close = 1;
  shutdown_before_close = 0;

  do_connect(loop, &tcp_client);

  ASSERT(write_cb_called == 0);
  ASSERT(close_cb_called == 0);
  ASSERT(shutdown_cb_called == 0);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(write_cb_called == 4);
  ASSERT(close_cb_called == 1);
  ASSERT(shutdown_cb_called == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}